

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::UniformBufferStorageTestCase::initTestCaseGlobal(UniformBufferStorageTestCase *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  GLenum GVar4;
  GLuint GVar5;
  uint uVar6;
  ostream *poVar7;
  uchar *puVar8;
  TestError *this_00;
  ulong uVar9;
  uint uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  char *tf_varying;
  GLint gl_max_uniform_block_size_value;
  string vs_body_define_string;
  char *vs_body_parts [3];
  stringstream vs_body_define_sstream;
  undefined1 local_198 [376];
  
  gl_max_uniform_block_size_value = 0;
  (*this->m_gl->getIntegerv)(0x8a30,&gl_max_uniform_block_size_value);
  (*this->m_gl->getIntegerv)(0x8a34,&this->m_gl_uniform_buffer_offset_alignment_value);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glGetIntegerv() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1913);
  this->m_n_ubo_uints = gl_max_uniform_block_size_value >> 2;
  std::__cxx11::stringstream::stringstream((stringstream *)&vs_body_define_sstream);
  vs_body_define_string._M_string_length = 0;
  vs_body_define_string.field_2._M_local_buf[0] = '\0';
  tf_varying = "result";
  vs_body_define_string._M_dataplus._M_p = (pointer)&vs_body_define_string.field_2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"#define N_UBO_UINTS (",0x15);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&vs_body_define_string,(string *)vs_body_parts);
  if ((char **)vs_body_parts[0] != vs_body_parts + 2) {
    operator_delete(vs_body_parts[0],(ulong)(vs_body_parts[2] + 1));
  }
  vs_body_parts[0] = "#version 140\n\n";
  vs_body_parts[1] = vs_body_define_string._M_dataplus._M_p;
  vs_body_parts[2] =
       "\nuniform data\n{\n    uint data_input[N_UBO_UINTS];};\n\nout uint result;\n\nvoid main()\n{\n    result = (data_input[gl_VertexID] == uint(gl_VertexID) ) ? 1u : 0u;\n}"
  ;
  GVar5 = SparseBufferTestUtilities::createProgram
                    (this->m_gl,(char **)0x0,0,vs_body_parts,3,(char **)0x0,(uint *)0x0,0,
                     &tf_varying,1,0x8c8c);
  this->m_po = GVar5;
  if (GVar5 == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"The test program failed to link",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
               ,0x193f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar12 = this->m_page_size;
  this->m_sparse_bo_data_size = iVar12 * 4;
  uVar10 = this->m_gl_uniform_buffer_offset_alignment_value * iVar12 * 2;
  uVar6 = iVar12 << 3;
  if ((uint)(iVar12 << 3) < uVar10) {
    uVar6 = uVar10;
  }
  this->m_sparse_bo_size = uVar6;
  this->m_sparse_bo_size_rounded = uVar6;
  this->m_sparse_bo_data_start_offset = uVar6 + iVar12 * -4 >> 1;
  uVar10 = this->m_n_ubo_uints;
  (*this->m_gl->genBuffers)(1,&this->m_tf_bo);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x195a);
  (*this->m_gl->bindBuffer)(0x8c8e,this->m_tf_bo);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x195d);
  (*this->m_gl->bufferStorage)(0x8c8e,(ulong)(uVar10 << 2),(void *)0x0,1);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glBufferStorage() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1961);
  (*this->m_gl->bindBufferBase)(0x8c8e,0,this->m_tf_bo);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1965);
  uVar10 = this->m_sparse_bo_data_size;
  puVar8 = (uchar *)operator_new__((ulong)uVar10,(nothrow_t *)&std::nothrow);
  this->m_ubo_data = puVar8;
  auVar3 = _DAT_01a25df0;
  auVar2 = _DAT_019fcc00;
  auVar1 = _DAT_019f5ce0;
  if (3 < (ulong)uVar10) {
    uVar10 = (uVar10 >> 2) - 1;
    auVar11._4_4_ = 0;
    auVar11._0_4_ = uVar10;
    auVar11._8_4_ = uVar10;
    auVar11._12_4_ = 0;
    uVar9 = 0;
    auVar11 = auVar11 ^ _DAT_019f5ce0;
    do {
      iVar13 = (int)uVar9;
      auVar14._8_4_ = iVar13;
      auVar14._0_8_ = uVar9;
      auVar14._12_4_ = (int)(uVar9 >> 0x20);
      auVar15 = (auVar14 | auVar2) ^ auVar1;
      iVar12 = auVar11._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar12 && auVar11._0_4_ < auVar15._0_4_ ||
                  iVar12 < auVar15._4_4_) & 1)) {
        *(int *)(puVar8 + uVar9 * 4) = iVar13;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        *(int *)(puVar8 + uVar9 * 4 + 4) = iVar13 + 1;
      }
      auVar14 = (auVar14 | auVar3) ^ auVar1;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar14._0_4_ <= auVar11._0_4_)) {
        *(int *)(puVar8 + uVar9 * 4 + 8) = iVar13 + 2;
        *(int *)(puVar8 + uVar9 * 4 + 0xc) = iVar13 + 3;
      }
      uVar9 = uVar9 + 4;
    } while (((ulong)uVar10 + 4 & 0xfffffffffffffffc) != uVar9);
  }
  (*this->m_gl->genBuffers)(1,&this->m_helper_bo);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1979);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x197c);
  (*this->m_gl->bufferStorage)(0x8f36,(ulong)this->m_sparse_bo_data_size,this->m_ubo_data,0);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glBufferStorage() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1980);
  (*this->m_gl->genVertexArrays)(1,&this->m_vao);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1984);
  (*this->m_gl->bindVertexArray)(this->m_vao);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x1987);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs_body_define_string._M_dataplus._M_p != &vs_body_define_string.field_2) {
    operator_delete(vs_body_define_string._M_dataplus._M_p,
                    CONCAT71(vs_body_define_string.field_2._M_allocated_capacity._1_7_,
                             vs_body_define_string.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&vs_body_define_sstream);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return true;
}

Assistant:

bool UniformBufferStorageTestCase::initTestCaseGlobal()
{
	/* Cache GL constant values */
	glw::GLint gl_max_uniform_block_size_value = 0;

	m_gl.getIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &gl_max_uniform_block_size_value);
	m_gl.getIntegerv(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT, &m_gl_uniform_buffer_offset_alignment_value);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetIntegerv() call(s) failed.");

	/* Determine the number of uints we can access at once from a single VS invocation */
	DE_ASSERT(gl_max_uniform_block_size_value >= 1);

	m_n_ubo_uints = static_cast<unsigned int>(gl_max_uniform_block_size_value / sizeof(unsigned int));

	/* Prepare the test program */
	std::stringstream vs_body_define_sstream;
	std::string		  vs_body_define_string;

	const char* tf_varying		 = "result";
	const char* vs_body_preamble = "#version 140\n"
								   "\n";

	const char* vs_body_main = "\n"
							   "uniform data\n"
							   "{\n"
							   "    uint data_input[N_UBO_UINTS];"
							   "};\n"
							   "\n"
							   "out uint result;\n"
							   "\n"
							   "void main()\n"
							   "{\n"
							   "    result = (data_input[gl_VertexID] == uint(gl_VertexID) ) ? 1u : 0u;\n"
							   "}";

	vs_body_define_sstream << "#define N_UBO_UINTS (" << m_n_ubo_uints << ")\n";
	vs_body_define_string = vs_body_define_sstream.str();

	const char*		   vs_body_parts[] = { vs_body_preamble, vs_body_define_string.c_str(), vs_body_main };
	const unsigned int n_vs_body_parts = sizeof(vs_body_parts) / sizeof(vs_body_parts[0]);

	m_po = SparseBufferTestUtilities::createProgram(m_gl, DE_NULL,							 /* fs_body_parts */
													0,										 /* n_fs_body_parts */
													vs_body_parts, n_vs_body_parts, DE_NULL, /* attribute_names */
													DE_NULL,								 /* attribute_locations */
													0,				/* n_attribute_properties */
													&tf_varying, 1, /* n_tf_varyings */
													GL_INTERLEAVED_ATTRIBS);

	if (m_po == 0)
	{
		TCU_FAIL("The test program failed to link");
	}

	/* Determine the number of bytes the sparse buffer needs to be able to have
	 * a physical backing or.
	 *
	 * We will provide physical backing for twice the required size and then use
	 * a region in the centered of the allocated memory block.
	 *
	 * NOTE: We need to be able to use an offset which is aligned to both the page size,
	 *       and the UB offset alignment.
	 * */
	m_sparse_bo_data_size = static_cast<unsigned int>(sizeof(unsigned int) * m_page_size);
	m_sparse_bo_size	  = (m_page_size * m_gl_uniform_buffer_offset_alignment_value) * 2;

	if (m_sparse_bo_size < m_sparse_bo_data_size * 2)
	{
		m_sparse_bo_size = m_sparse_bo_data_size * 2;
	}

	m_sparse_bo_size_rounded	  = m_sparse_bo_size; /* rounded to the page size by default */
	m_sparse_bo_data_start_offset = (m_sparse_bo_size - m_sparse_bo_data_size) / 2;

	/* Set up the TFBO storage */
	const unsigned tfbo_size = static_cast<unsigned int>(sizeof(unsigned int) * m_n_ubo_uints);

	m_gl.genBuffers(1, &m_tf_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_tf_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferStorage(GL_TRANSFORM_FEEDBACK_BUFFER, tfbo_size, DE_NULL, /* data */
					   GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferStorage() call failed.");

	m_gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
						m_tf_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBufferBase() call failed.");

	/* Set up the UBO contents. We're actually setting up an immutable BO here,
	 * but we'll use its contents for a copy op, executed at the beginning of
	 * each iteration.
	 */
	unsigned int* ubo_data_traveller_ptr = DE_NULL;

	DE_ASSERT((m_sparse_bo_data_size % sizeof(unsigned int)) == 0);

	m_ubo_data			   = new (std::nothrow) unsigned char[m_sparse_bo_data_size];
	ubo_data_traveller_ptr = (unsigned int*)m_ubo_data;

	for (unsigned int n_vertex = 0; n_vertex < m_sparse_bo_data_size / sizeof(unsigned int); ++n_vertex)
	{
		*ubo_data_traveller_ptr = n_vertex;
		ubo_data_traveller_ptr++;
	}

	m_gl.genBuffers(1, &m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	/* Set up helper BO storage */
	m_gl.bufferStorage(GL_COPY_READ_BUFFER, m_sparse_bo_data_size, m_ubo_data, 0); /* flags */
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferStorage() call failed.");

	/* Set up the VAO */
	m_gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenVertexArrays() call failed.");

	m_gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindVertexArray() call failed.");

	return true;
}